

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

int __thiscall QIconModeViewBase::itemIndex(QIconModeViewBase *this,QListViewItem *item)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  
  bVar3 = QListViewItem::isValid(item);
  if (!bVar3) {
    return -1;
  }
  iVar7 = item->indexHint;
  uVar6 = (this->items).d.size;
  if ((long)iVar7 < (long)uVar6) {
    bVar3 = QListViewItem::operator==((this->items).d.ptr + iVar7,item);
    if (bVar3) {
      return iVar7;
    }
    uVar6 = (ulong)(uint)(this->items).d.size;
  }
  else {
    iVar7 = (int)uVar6 + -1;
  }
  bVar3 = true;
  bVar4 = true;
  iVar2 = iVar7;
  do {
    bVar1 = bVar4;
    if ((!bVar3) && (!bVar1)) {
      return -1;
    }
    if (bVar3) {
      lVar5 = (long)iVar7;
      bVar3 = QListViewItem::operator==((this->items).d.ptr + lVar5,item);
      iVar8 = iVar7;
      if (bVar3) {
LAB_00519efb:
        (this->items).d.ptr[lVar5].indexHint = iVar8;
        return iVar8;
      }
      iVar7 = iVar7 + 1;
      bVar3 = iVar7 < (int)uVar6;
    }
    else {
      bVar3 = false;
    }
    bVar4 = false;
    if (bVar1) {
      lVar5 = (long)iVar2;
      bVar4 = QListViewItem::operator==((this->items).d.ptr + lVar5,item);
      iVar8 = iVar2;
      if (bVar4) goto LAB_00519efb;
      bVar4 = 0 < iVar2;
      iVar2 = iVar2 + -1;
    }
  } while( true );
}

Assistant:

int QIconModeViewBase::itemIndex(const QListViewItem &item) const
{
    if (!item.isValid())
        return -1;
    int i = item.indexHint;
    if (i < items.size()) {
        if (items.at(i) == item)
            return i;
    } else {
        i = items.size() - 1;
    }

    int j = i;
    int c = items.size();
    bool a = true;
    bool b = true;

    while (a || b) {
        if (a) {
            if (items.at(i) == item) {
                items.at(i).indexHint = i;
                return i;
            }
            a = ++i < c;
        }
        if (b) {
            if (items.at(j) == item) {
                items.at(j).indexHint = j;
                return j;
            }
            b = --j > -1;
        }
    }
    return -1;
}